

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-flow.c
# Opt level: O0

_Bool borg_can_dig(_Bool check_fail,uint8_t feat)

{
  _Bool _Var1;
  int local_10;
  _Bool local_9;
  wchar_t dig_check;
  uint8_t feat_local;
  _Bool check_fail_local;
  
  if (borg.trait[0x6d] == 0) {
    if (((feat == '\x16') || (feat == '\x17')) || (feat < 0xf)) {
      local_9 = false;
    }
    else {
      local_10 = 0xd;
      if (feat == '\x15') {
        local_10 = 0x28;
      }
      if (0x15 < borg.times_twitch) {
        local_10 = local_10 + -0x14;
      }
      if ((((weapon_swap == 0) || (borg.trait[0x3f] < local_10)) ||
          (borg_items[weapon_swap + -1].tval != '\x06')) && (borg.trait[0x3f] < local_10 + 0x14)) {
        if ((feat == '\x10') && (borg.trait[0x6c] == 0)) {
          local_9 = true;
        }
        else {
          if (check_fail) {
            _Var1 = borg_spell_okay_fail(TURN_STONE_TO_MUD,0x28);
            if (((_Var1) || (_Var1 = borg_spell_okay_fail(SHATTER_STONE,0x28), _Var1)) ||
               ((_Var1 = borg_equips_item(act_stone_to_mud,true), _Var1 ||
                (_Var1 = borg_equips_ring(sv_ring_digging), _Var1)))) {
              return true;
            }
          }
          else {
            _Var1 = borg_spell_okay(TURN_STONE_TO_MUD);
            if ((((_Var1) || (_Var1 = borg_spell_okay(SHATTER_STONE), _Var1)) ||
                (_Var1 = borg_equips_item(act_stone_to_mud,false), _Var1)) ||
               (_Var1 = borg_equips_ring(sv_ring_digging), _Var1)) {
              return true;
            }
          }
          local_9 = false;
        }
      }
      else {
        local_9 = true;
      }
    }
  }
  else {
    local_9 = false;
  }
  return local_9;
}

Assistant:

bool borg_can_dig(bool check_fail, uint8_t feat)
{
    /* No digging when hungry */
    if (borg.trait[BI_ISHUNGRY])
        return false;

    /* some features can't be dug out */
    if (feat == FEAT_PERM || feat == FEAT_LAVA || feat < FEAT_SECRET)
        return false;

    int dig_check = feat == FEAT_GRANITE ? BORG_DIG_HARD : BORG_DIG;

    /* try digging even if it is hard when out of moves */
    if (borg.times_twitch > 21)
        dig_check -= 20;

    if ((weapon_swap && borg.trait[BI_DIG] >= dig_check
            && borg_items[weapon_swap - 1].tval == TV_DIGGING)
        || (borg.trait[BI_DIG] >= dig_check + 20))
        return true;

    if (feat == FEAT_RUBBLE && !borg.trait[BI_ISWEAK])
        return true;

    if (check_fail) {
        if (borg_spell_okay_fail(TURN_STONE_TO_MUD, 40)
            || borg_spell_okay_fail(SHATTER_STONE, 40)
            || borg_equips_item(act_stone_to_mud, true)
            || borg_equips_ring(sv_ring_digging))
            return true;
    } else {
        if (borg_spell_okay(TURN_STONE_TO_MUD) 
            || borg_spell_okay(SHATTER_STONE)
            || borg_equips_item(act_stone_to_mud, false)
            || borg_equips_ring(sv_ring_digging))
            return true;
    }

    return false;
}